

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31Context.cpp
# Opt level: O0

void __thiscall deqp::gles31::Context::Context(Context *this,TestContext *testCtx)

{
  RunMode RVar1;
  ApiType apiType;
  CommandLine *this_00;
  DummyRenderContext *this_01;
  ContextType local_1c;
  TestContext *local_18;
  TestContext *testCtx_local;
  Context *this_local;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = (RenderContext *)0x0;
  this->m_contextInfo = (ContextInfo *)0x0;
  local_18 = testCtx;
  testCtx_local = (TestContext *)this;
  this_00 = tcu::TestContext::getCommandLine(this->m_testCtx);
  RVar1 = tcu::CommandLine::getRunMode(this_00);
  if (RVar1 == RUNMODE_EXECUTE) {
    createRenderContext(this);
  }
  else {
    this_01 = (DummyRenderContext *)operator_new(0x1a58);
    apiType = glu::ApiType::es(3,1);
    glu::ContextType::ContextType(&local_1c,apiType,0);
    glu::DummyRenderContext::DummyRenderContext(this_01,local_1c);
    this->m_renderCtx = (RenderContext *)this_01;
  }
  return;
}

Assistant:

Context::Context (tcu::TestContext& testCtx)
	: m_testCtx		(testCtx)
	, m_renderCtx	(DE_NULL)
	, m_contextInfo	(DE_NULL)
{
	if (m_testCtx.getCommandLine().getRunMode() == tcu::RUNMODE_EXECUTE)
		createRenderContext();
	else
	{
		// \todo [2016-11-15 pyry] Many tests (erroneously) inspect context type
		//						   during test hierarchy construction. We should fix that
		//						   and revert dummy context to advertise unknown context type.
		m_renderCtx = new glu::DummyRenderContext(glu::ContextType(glu::ApiType::es(3,1)));
	}
}